

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

uint uv_available_parallelism(void)

{
  int iVar1;
  double dVar2;
  undefined1 local_b0 [8];
  uv__cpu_constraint c;
  double rc_with_cgroup;
  long rc;
  cpu_set_t set;
  
  memset(local_b0,0,0x18);
  memset(&rc,0,0x80);
  iVar1 = sched_getaffinity(0,0x80,(cpu_set_t *)&rc);
  if (iVar1 == 0) {
    iVar1 = __sched_cpucount(0x80,(cpu_set_t *)&rc);
    rc_with_cgroup = (double)(long)iVar1;
  }
  else {
    rc_with_cgroup = (double)sysconf(0x54);
  }
  iVar1 = uv__get_constrained_cpu((uv__cpu_constraint *)local_b0);
  if (((iVar1 == 0) && (0 < c.quota_per_period)) &&
     (dVar2 = ((double)(long)local_b0 / (double)c.quota_per_period) * (double)c.period_length,
     dVar2 < (double)(long)rc_with_cgroup)) {
    rc_with_cgroup = (double)(long)dVar2;
  }
  if ((long)rc_with_cgroup < 1) {
    rc_with_cgroup = 4.94065645841247e-324;
  }
  return SUB84(rc_with_cgroup,0);
}

Assistant:

unsigned int uv_available_parallelism(void) {
#ifdef __linux__
  cpu_set_t set;
  long rc;
  double rc_with_cgroup;
  uv__cpu_constraint c = {0, 0, 0.0};

  memset(&set, 0, sizeof(set));

  /* sysconf(_SC_NPROCESSORS_ONLN) in musl calls sched_getaffinity() but in
   * glibc it's... complicated... so for consistency try sched_getaffinity()
   * before falling back to sysconf(_SC_NPROCESSORS_ONLN).
   */
  if (0 == sched_getaffinity(0, sizeof(set), &set))
    rc = CPU_COUNT(&set);
  else
    rc = sysconf(_SC_NPROCESSORS_ONLN);
    
  if (uv__get_constrained_cpu(&c) == 0 && c.period_length > 0) {
    rc_with_cgroup = (double)c.quota_per_period / c.period_length * c.proportions;
    if (rc_with_cgroup < rc)
      rc = (long)rc_with_cgroup; /* Casting is safe since rc_with_cgroup < rc < LONG_MAX */
  }
  if (rc < 1) 
    rc = 1;

  return (unsigned) rc;
#elif defined(__MVS__)
  int rc;

  rc = __get_num_online_cpus();
  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#else  /* __linux__ */
  long rc;

  rc = sysconf(_SC_NPROCESSORS_ONLN);
  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#endif  /* __linux__ */
}